

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketConnection.cpp
# Opt level: O3

bool __thiscall
FIX::ThreadedSocketConnection::setSession(ThreadedSocketConnection *this,string *msg)

{
  Log *pLVar1;
  bool bVar2;
  Session *pSVar3;
  iterator iVar4;
  int iVar5;
  SessionID sessionID;
  undefined1 local_190 [96];
  FieldBase local_130;
  FieldBase local_d0;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  pSVar3 = Session::lookupSession(msg,true);
  this->m_pSession = pSVar3;
  if (pSVar3 == (Session *)0x0) {
    pLVar1 = this->m_pLog;
    if (pLVar1 != (Log *)0x0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
                     "Session not found for incoming message: ",msg);
      (*pLVar1->_vptr_Log[6])
                (pLVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_190);
      if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
        operator_delete((void *)local_190._0_8_,(ulong)(local_190._16_8_ + 1));
      }
      (*this->m_pLog->_vptr_Log[4])(this->m_pLog,msg);
    }
    return false;
  }
  SessionID::SessionID((SessionID *)local_190,&pSVar3->m_sessionID);
  this->m_pSession = (Session *)0x0;
  iVar5 = 5;
  do {
    bVar2 = Session::isSessionRegistered((SessionID *)local_190);
    if (bVar2) {
      pSVar3 = this->m_pSession;
    }
    else {
      pSVar3 = Session::registerSession((SessionID *)local_190);
      this->m_pSession = pSVar3;
    }
    if (pSVar3 != (Session *)0x0) goto LAB_001b7e56;
    process_sleep(1.0);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  pSVar3 = this->m_pSession;
  if (pSVar3 != (Session *)0x0) {
LAB_001b7e56:
    iVar4 = std::
            _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
            ::find(&(this->m_sessions)._M_t,&pSVar3->m_sessionID);
    if ((_Rb_tree_header *)iVar4._M_node != &(this->m_sessions)._M_t._M_impl.super__Rb_tree_header)
    {
      bVar2 = true;
      Session::setResponder(this->m_pSession,&this->super_Responder);
      goto LAB_001b7ee9;
    }
  }
  bVar2 = false;
LAB_001b7ee9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
  }
  FieldBase::~FieldBase(&local_d0);
  FieldBase::~FieldBase(&local_130);
  FieldBase::~FieldBase((FieldBase *)local_190);
  return bVar2;
}

Assistant:

bool ThreadedSocketConnection::setSession( const std::string& msg )
{
  m_pSession = Session::lookupSession( msg, true );
  if ( !m_pSession ) 
  {
    if( m_pLog )
    {
      m_pLog->onEvent( "Session not found for incoming message: " + msg );
      m_pLog->onIncoming( msg );
    }
    return false;
  }

  SessionID sessionID = m_pSession->getSessionID();
  m_pSession = 0;

  // see if the session frees up within 5 seconds
  for( int i = 1; i <= 5; i++ )
  {
    if( !Session::isSessionRegistered( sessionID ) )
      m_pSession = Session::registerSession( sessionID );
    if( m_pSession ) break;
    process_sleep( 1 );
  }

  if ( !m_pSession ) 
    return false;
  if ( m_sessions.find(m_pSession->getSessionID()) == m_sessions.end() )
    return false;

  m_pSession->setResponder( this );
  return true;
}